

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<double>::Decompose_LDLt
          (TPZSkylMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  double **ppdVar2;
  char cVar3;
  double **ppdVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  double *pdVar8;
  _List_node_base *p_Var9;
  long lVar10;
  _List_node_base *p_Var11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  _List_node_base *p_Var20;
  double dVar21;
  double extraout_XMM0_Qa;
  long local_70;
  long local_68;
  long local_60;
  
  cVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar3 != '\0') {
    if (cVar3 == '\x04') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Decompose_LDLt(std::list<int64_t> &) [TVar = double]"
               ,"Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(singular);
  iVar6 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  if (1 < CONCAT44(extraout_var,iVar6)) {
    lVar18 = 1;
    local_60 = 2;
    local_68 = 3;
    lVar17 = 8;
    local_70 = 0x10;
    do {
      ppdVar4 = (this->fElem).fStore;
      lVar7 = (long)ppdVar4[lVar18 + 1] - (long)ppdVar4[lVar18] >> 3;
      if (0 < lVar7) {
        p_Var20 = (_List_node_base *)((lVar18 - lVar7) + 1);
        lVar10 = local_60 - lVar7;
        lVar19 = local_68 - lVar7;
        lVar7 = local_70 + lVar7 * -8;
        p_Var9 = p_Var20;
        do {
          ppdVar4 = (this->fElem).fStore;
          pdVar8 = ppdVar4[(long)p_Var9];
          lVar14 = (long)ppdVar4[(long)((long)&p_Var9->_M_next + 1)] - (long)pdVar8 >> 3;
          p_Var11 = (_List_node_base *)((long)p_Var9 + (1 - lVar14));
          if ((long)p_Var11 < (long)p_Var20) {
            p_Var11 = p_Var20;
          }
          if ((long)p_Var11 < (long)p_Var9) {
            lVar14 = lVar19 - lVar14;
            lVar16 = lVar14;
            if (lVar14 < lVar10) {
              lVar16 = lVar10;
            }
            lVar12 = (long)ppdVar4[lVar18] + lVar17;
            lVar15 = (long)pdVar8 + lVar7;
            dVar21 = 0.0;
            do {
              ppdVar2 = ppdVar4 + (long)p_Var11;
              p_Var11 = (_List_node_base *)((long)&p_Var11->_M_next + 1);
              dVar21 = dVar21 + *(double *)(lVar12 + lVar16 * -8) *
                                *(double *)(lVar15 + lVar16 * -8) * **ppdVar2;
              lVar12 = lVar12 + -8;
              lVar15 = lVar15 + -8;
            } while ((long)p_Var11 < (long)p_Var9);
            if (lVar14 < lVar10) {
              lVar14 = lVar10;
            }
            pdVar13 = (double *)(lVar12 + lVar14 * -8);
          }
          else {
            pdVar13 = ppdVar4[lVar18] + (lVar18 - (long)p_Var11);
            pdVar8 = pdVar8 + ((long)p_Var9 - (long)p_Var11);
            dVar21 = 0.0;
          }
          dVar21 = *pdVar13 - dVar21;
          *pdVar13 = dVar21;
          if (pdVar8 == pdVar13) {
            if (ABS(dVar21) < 1e-12) {
              p_Var11 = (_List_node_base *)operator_new(0x18);
              p_Var11[1]._M_next = p_Var9;
              std::__detail::_List_node_base::_M_hook(p_Var11);
              psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
                        _M_size;
              *psVar1 = *psVar1 + 1;
              dVar21 = 1.0;
              goto LAB_00cc26d5;
            }
          }
          else {
            dVar21 = dVar21 / *pdVar8;
LAB_00cc26d5:
            *pdVar13 = dVar21;
          }
          lVar19 = lVar19 + 1;
          lVar7 = lVar7 + 8;
          bVar5 = (long)p_Var9 < lVar18;
          p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 1);
        } while (bVar5);
      }
      lVar18 = lVar18 + 1;
      local_60 = local_60 + 1;
      local_68 = local_68 + 1;
      lVar17 = lVar17 + 8;
      local_70 = local_70 + 8;
    } while (lVar18 != CONCAT44(extraout_var,iVar6));
  }
  lVar17 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar17 != 0) &&
     ((*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (this,lVar17 + -1), ABS(extraout_XMM0_Qa) < 1e-12)) {
    lVar17 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)(lVar17 + -1);
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
              (this,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + -1);
  }
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt(std::list<int64_t> &singular)
{
    if( this->fDecomposed == ELDLt) return 1;
    if ( this->fDecomposed )
    {
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    }
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt(singular)");
#endif
    
    singular.clear();
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TVar sum;
    j = 1;
    while(j < dimension) {
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            sum = 0.;
            //EBORIN: 
            // Is this a hot spot?
            while(k < l) {
                sum += *elj-- * *ell-- * *(fElem[k++]);
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
                singular.push_back(l);
                *elj = 1.;
            }
            l++;
        }
        j++;
    }
    
    if(this->Rows() && IsZero(GetVal(this->Rows()-1,this->Rows()-1)))
    {
        singular.push_back(this->Rows()-1);
        PutVal(this->Rows()-1,this->Rows()-1,1.);
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}